

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.h
# Opt level: O0

void __thiscall
pbrt::ShapeSceneEntity::ShapeSceneEntity
          (ShapeSceneEntity *this,string *name,ParameterDictionary *parameters,FileLoc loc,
          Transform *renderFromObject,Transform *objectFromRender,bool reverseOrientation,
          int materialIndex,string *materialName,int lightIndex,string *insideMedium,
          string *outsideMedium)

{
  FileLoc loc_00;
  undefined8 in_RCX;
  SceneEntity *in_RDX;
  char *in_RSI;
  size_t in_RDI;
  undefined8 in_R8;
  byte in_R9B;
  undefined4 in_stack_00000020;
  string *in_stack_00000028;
  undefined4 in_stack_00000030;
  string *in_stack_00000038;
  string *in_stack_00000040;
  ParameterDictionary *in_stack_fffffffffffffef8;
  ParameterDictionary *in_stack_ffffffffffffff00;
  string *in_stack_ffffffffffffff08;
  undefined1 *puVar1;
  undefined1 local_a0 [119];
  byte local_29;
  undefined8 local_28;
  undefined8 local_20;
  
  local_29 = in_R9B & 1;
  puVar1 = local_a0;
  local_28 = in_R8;
  local_20 = in_RCX;
  ParameterDictionary::ParameterDictionary(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  loc_00.filename._M_str = in_RSI;
  loc_00.filename._M_len = in_RDI;
  loc_00._16_8_ = puVar1;
  SceneEntity::SceneEntity(in_RDX,in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,loc_00);
  ParameterDictionary::~ParameterDictionary((ParameterDictionary *)0x53adf4);
  *(undefined8 *)(in_RDI + 0x90) = local_20;
  *(undefined8 *)(in_RDI + 0x98) = local_28;
  *(byte *)(in_RDI + 0xa0) = local_29 & 1;
  *(undefined4 *)(in_RDI + 0xa4) = in_stack_00000020;
  std::__cxx11::string::string((string *)(in_RDI + 0xa8),in_stack_00000028);
  *(undefined4 *)(in_RDI + 200) = in_stack_00000030;
  std::__cxx11::string::string((string *)(in_RDI + 0xd0),in_stack_00000038);
  std::__cxx11::string::string((string *)(in_RDI + 0xf0),in_stack_00000040);
  return;
}

Assistant:

ShapeSceneEntity(const std::string &name, ParameterDictionary parameters, FileLoc loc,
                     const Transform *renderFromObject, const Transform *objectFromRender,
                     bool reverseOrientation, int materialIndex,
                     const std::string &materialName, int lightIndex,
                     const std::string &insideMedium, const std::string &outsideMedium)
        : SceneEntity(name, parameters, loc),
          renderFromObject(renderFromObject),
          objectFromRender(objectFromRender),
          reverseOrientation(reverseOrientation),
          materialIndex(materialIndex),
          materialName(materialName),
          lightIndex(lightIndex),
          insideMedium(insideMedium),
          outsideMedium(outsideMedium) {}